

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

void __thiscall
spvtools::opt::InstructionBuilder::InstructionBuilder
          (InstructionBuilder *this,IRContext *context,Instruction *insert_before,
          Analysis preserved_analyses)

{
  BasicBlock *parent;
  InsertionPointTy local_28;
  
  parent = IRContext::get_instr_block(context,insert_before);
  local_28.super_iterator.node_ = (iterator)(iterator)insert_before;
  InstructionBuilder(this,context,parent,&local_28,preserved_analyses);
  return;
}

Assistant:

InstructionBuilder(
      IRContext* context, Instruction* insert_before,
      IRContext::Analysis preserved_analyses = IRContext::kAnalysisNone)
      : InstructionBuilder(context, context->get_instr_block(insert_before),
                           InsertionPointTy(insert_before),
                           preserved_analyses) {}